

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_controller.cpp
# Opt level: O0

void __thiscall
r_exec::AntiPGMController::AntiPGMController(AntiPGMController *this,View *ipgm_view)

{
  Overlay *o;
  P<r_exec::Overlay> local_20;
  View *local_18;
  View *ipgm_view_local;
  AntiPGMController *this_local;
  
  local_18 = ipgm_view;
  ipgm_view_local = (View *)this;
  _PGMController::_PGMController(&this->super__PGMController,ipgm_view);
  (this->super__PGMController).super_OController.super_Controller.super__Object._vptr__Object =
       (_func_int **)&PTR__AntiPGMController_002ecf30;
  (this->super__PGMController).field_0x99 = 0;
  std::mutex::mutex(&this->m_hostMutex);
  o = (Overlay *)operator_new(0xe8);
  AntiPGMOverlay::AntiPGMOverlay((AntiPGMOverlay *)o,(Controller *)this);
  core::P<r_exec::Overlay>::P(&local_20,o);
  r_code::list<core::P<r_exec::Overlay>_>::push_back
            (&(this->super__PGMController).super_OController.overlays,&local_20);
  core::P<r_exec::Overlay>::~P(&local_20);
  return;
}

Assistant:

AntiPGMController::AntiPGMController(r_code::View *ipgm_view): _PGMController(ipgm_view), successful_match(false)
{
    overlays.push_back(new AntiPGMOverlay(this));
}